

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::skipComment(Scanner *this)

{
  iterator pcVar1;
  iterator I;
  Scanner *this_local;
  
  if (*this->Current == '#') {
    while (pcVar1 = skip_nb_char(this,this->Current), pcVar1 != this->Current) {
      this->Current = pcVar1;
      this->Column = this->Column + 1;
    }
  }
  return;
}

Assistant:

void Scanner::skipComment() {
  if (*Current != '#')
    return;
  while (true) {
    // This may skip more than one byte, thus Column is only incremented
    // for code points.
    StringRef::iterator I = skip_nb_char(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }
}